

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

ftrl_data<float> * readFromlibsvm<float>(ftrl_data<float> *__return_storage_ptr__,char *cdata)

{
  int iVar1;
  bool bVar2;
  double dVar3;
  float local_38 [5];
  value_type local_24;
  char local_1e;
  undefined1 local_1d;
  uint local_1c;
  char prefix;
  char *pcStack_18;
  uint begin;
  char *cdata_local;
  ftrl_data<float> *data;
  
  local_1c = 0;
  local_1d = 0;
  pcStack_18 = cdata;
  cdata_local = (char *)__return_storage_ptr__;
  ftrl_data<float>::ftrl_data(__return_storage_ptr__);
  local_1e = ' ';
  do {
    if (pcStack_18[local_1c] == '\0') {
      return __return_storage_ptr__;
    }
    if (local_1e == ' ') {
      if (pcStack_18[local_1c + 1] == '\n') {
        return __return_storage_ptr__;
      }
      iVar1 = atoi(pcStack_18 + local_1c);
      local_24 = iVar1 - 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&__return_storage_ptr__->indexs,&local_24);
      while( true ) {
        bVar2 = false;
        if (pcStack_18[local_1c] != '\0') {
          bVar2 = pcStack_18[local_1c] != ':';
        }
        if (!bVar2) break;
        local_1c = local_1c + 1;
      }
    }
    else {
      dVar3 = atof(pcStack_18 + (ulong)local_1c + 1);
      local_38[0] = (float)dVar3;
      std::vector<float,_std::allocator<float>_>::push_back(&__return_storage_ptr__->data,local_38);
      while( true ) {
        bVar2 = false;
        if (pcStack_18[local_1c] != '\0') {
          bVar2 = pcStack_18[local_1c] != ' ';
        }
        if (!bVar2) break;
        local_1c = local_1c + 1;
      }
    }
    local_1e = pcStack_18[local_1c];
  } while( true );
}

Assistant:

ftrl_data<T> readFromlibsvm(const char * cdata) {
    unsigned int begin = 0;
    ftrl_data<T> data;
    char prefix = ' ';
    while (cdata[begin] != '\0') {
        if (prefix == ' ') {
            if (cdata[begin + 1] == '\n') { //if there is a \n after a space, then we go to next line
                break;
            }
            data.indexs.push_back((unsigned int)atoi(cdata + begin) - 1);
            while (cdata[begin] != '\0' && cdata[begin] != ':') {
                ++begin;
            }
        } else {
            data.data.push_back((float)atof(cdata + begin + 1));
            while (cdata[begin] != '\0' && cdata[begin] != ' ') {
                ++begin;
            }
        }
        prefix = cdata[begin];
    }
    return data;
}